

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
          (KNearestNeighborsClassifier *this,KNearestNeighborsClassifier *from)

{
  bool bVar1;
  ClassLabelsCase CVar2;
  DefaultClassLabelCase DVar3;
  WeightingSchemeCase WVar4;
  InternalMetadataWithArenaLite *this_00;
  NearestNeighborsIndex *this_01;
  Int64Parameter *this_02;
  StringVector *this_03;
  StringVector *from_00;
  Int64Vector *this_04;
  Int64Vector *from_01;
  string *value;
  int64 value_00;
  UniformWeighting *this_05;
  UniformWeighting *from_02;
  InverseDistanceWeighting *this_06;
  InverseDistanceWeighting *from_03;
  KNearestNeighborsClassifier *from_local;
  KNearestNeighborsClassifier *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__KNearestNeighborsClassifier_0056b5a8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  ClassLabelsUnion::ClassLabelsUnion((ClassLabelsUnion *)&this->ClassLabels_);
  DefaultClassLabelUnion::DefaultClassLabelUnion
            ((DefaultClassLabelUnion *)&(this->DefaultClassLabel_).defaultstringlabel_);
  WeightingSchemeUnion::WeightingSchemeUnion((WeightingSchemeUnion *)&this->WeightingScheme_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  bVar1 = has_nearestneighborsindex(from);
  if (bVar1) {
    this_01 = (NearestNeighborsIndex *)operator_new(0x50);
    NearestNeighborsIndex::NearestNeighborsIndex(this_01,from->nearestneighborsindex_);
    this->nearestneighborsindex_ = this_01;
  }
  else {
    this->nearestneighborsindex_ = (NearestNeighborsIndex *)0x0;
  }
  bVar1 = has_numberofneighbors(from);
  if (bVar1) {
    this_02 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_02,from->numberofneighbors_);
    this->numberofneighbors_ = this_02;
  }
  else {
    this->numberofneighbors_ = (Int64Parameter *)0x0;
  }
  clear_has_ClassLabels(this);
  CVar2 = ClassLabels_case(from);
  if (CVar2 != CLASSLABELS_NOT_SET) {
    if (CVar2 == kStringClassLabels) {
      this_03 = mutable_stringclasslabels(this);
      from_00 = stringclasslabels(from);
      StringVector::MergeFrom(this_03,from_00);
    }
    else if (CVar2 == kInt64ClassLabels) {
      this_04 = mutable_int64classlabels(this);
      from_01 = int64classlabels(from);
      Int64Vector::MergeFrom(this_04,from_01);
    }
  }
  clear_has_DefaultClassLabel(this);
  DVar3 = DefaultClassLabel_case(from);
  if (DVar3 != DEFAULTCLASSLABEL_NOT_SET) {
    if (DVar3 == kDefaultStringLabel) {
      value = defaultstringlabel_abi_cxx11_(from);
      set_defaultstringlabel(this,value);
    }
    else if (DVar3 == kDefaultInt64Label) {
      value_00 = defaultint64label(from);
      set_defaultint64label(this,value_00);
    }
  }
  clear_has_WeightingScheme(this);
  WVar4 = WeightingScheme_case(from);
  if (WVar4 != WEIGHTINGSCHEME_NOT_SET) {
    if (WVar4 == kUniformWeighting) {
      this_05 = mutable_uniformweighting(this);
      from_02 = uniformweighting(from);
      UniformWeighting::MergeFrom(this_05,from_02);
    }
    else if (WVar4 == kInverseDistanceWeighting) {
      this_06 = mutable_inversedistanceweighting(this);
      from_03 = inversedistanceweighting(from);
      InverseDistanceWeighting::MergeFrom(this_06,from_03);
    }
  }
  return;
}

Assistant:

KNearestNeighborsClassifier::KNearestNeighborsClassifier(const KNearestNeighborsClassifier& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_nearestneighborsindex()) {
    nearestneighborsindex_ = new ::CoreML::Specification::NearestNeighborsIndex(*from.nearestneighborsindex_);
  } else {
    nearestneighborsindex_ = NULL;
  }
  if (from.has_numberofneighbors()) {
    numberofneighbors_ = new ::CoreML::Specification::Int64Parameter(*from.numberofneighbors_);
  } else {
    numberofneighbors_ = NULL;
  }
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  clear_has_DefaultClassLabel();
  switch (from.DefaultClassLabel_case()) {
    case kDefaultStringLabel: {
      set_defaultstringlabel(from.defaultstringlabel());
      break;
    }
    case kDefaultInt64Label: {
      set_defaultint64label(from.defaultint64label());
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  clear_has_WeightingScheme();
  switch (from.WeightingScheme_case()) {
    case kUniformWeighting: {
      mutable_uniformweighting()->::CoreML::Specification::UniformWeighting::MergeFrom(from.uniformweighting());
      break;
    }
    case kInverseDistanceWeighting: {
      mutable_inversedistanceweighting()->::CoreML::Specification::InverseDistanceWeighting::MergeFrom(from.inversedistanceweighting());
      break;
    }
    case WEIGHTINGSCHEME_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.KNearestNeighborsClassifier)
}